

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

void __thiscall Clasp::Clause::detach(Clause *this,Solver *s)

{
  bool bVar1;
  uint32 uVar2;
  Solver *this_00;
  Solver *in_RSI;
  Solver *in_RDI;
  Literal *eoc;
  Var in_stack_ffffffffffffffbc;
  Solver *in_stack_ffffffffffffffc0;
  Solver *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  Literal p;
  undefined4 in_stack_ffffffffffffffe0;
  uint32 in_stack_ffffffffffffffe4;
  
  p.rep_ = (uint32)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  bVar1 = contracted((Clause *)0x22ca8d);
  if (bVar1) {
    this_00 = (Solver *)end((Clause *)in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffe4 = (this_00->rng).seed_;
    bVar1 = Solver::isFalse(in_stack_ffffffffffffffc8,p);
    if (bVar1) {
      Literal::var((Literal *)this_00);
      uVar2 = Solver::level(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if (uVar2 != 0) {
        Literal::var((Literal *)this_00);
        Solver::level(in_RSI,in_stack_ffffffffffffffbc);
        Solver::removeUndoWatch(this_00,in_stack_ffffffffffffffe4,(Constraint *)in_RDI);
      }
    }
  }
  ClauseHead::detach((ClauseHead *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_RDI);
  return;
}

Assistant:

void Clause::detach(Solver& s) {
	if (contracted()) {
		Literal* eoc = end();
		if (s.isFalse(*eoc) && s.level(eoc->var()) != 0) {
			s.removeUndoWatch(s.level(eoc->var()), this);
		}
	}
	ClauseHead::detach(s);
}